

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateAddDependency(HelicsFederate fed,char *fedName,HelicsError *err)

{
  Federate *this;
  FedObject *pFVar1;
  size_t sVar2;
  string_view fedName_00;
  
  pFVar1 = helics::getFedObject(fed,err);
  if ((pFVar1 != (FedObject *)0x0) &&
     (this = (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, this != (Federate *)0x0)) {
    if (fedName == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "Federate name for dependency cannot be null";
      }
    }
    else {
      sVar2 = strlen(fedName);
      fedName_00._M_str = fedName;
      fedName_00._M_len = sVar2;
      helics::Federate::addDependency(this,fedName_00);
    }
  }
  return;
}

Assistant:

void helicsFederateAddDependency(HelicsFederate fed, const char* fedName, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    if (fedName == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidFedNameString);
        return;
    }
    try {
        fedObj->addDependency(fedName);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}